

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::ChineseCalendar::newMoonNear(ChineseCalendar *this,double days,UBool after)

{
  CalendarAstronomer *pCVar1;
  undefined7 in_register_00000031;
  size_t size;
  double dVar2;
  UDate millis;
  MoonAge local_20;
  
  size = CONCAT71(in_register_00000031,after);
  umtx_lock_63(&astroLock);
  if (gChineseCalendarAstro == (CalendarAstronomer *)0x0) {
    pCVar1 = (CalendarAstronomer *)UMemory::operator_new((UMemory *)0x88,size);
    if (pCVar1 != (CalendarAstronomer *)0x0) {
      CalendarAstronomer::CalendarAstronomer(pCVar1);
    }
    gChineseCalendarAstro = pCVar1;
    ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
  }
  pCVar1 = gChineseCalendarAstro;
  dVar2 = daysToMillis(this,days);
  CalendarAstronomer::setTime(pCVar1,dVar2);
  pCVar1 = gChineseCalendarAstro;
  local_20 = CalendarAstronomer::NEW_MOON();
  millis = CalendarAstronomer::getMoonTime(pCVar1,&local_20,after);
  umtx_unlock_63(&astroLock);
  dVar2 = millisToDays(this,millis);
  return (int)dVar2;
}

Assistant:

int32_t ChineseCalendar::newMoonNear(double days, UBool after) const {
    
    umtx_lock(&astroLock);
    if(gChineseCalendarAstro == NULL) {
        gChineseCalendarAstro = new CalendarAstronomer();
        ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
    }
    gChineseCalendarAstro->setTime(daysToMillis(days));
    UDate newMoon = gChineseCalendarAstro->getMoonTime(CalendarAstronomer::NEW_MOON(), after);
    umtx_unlock(&astroLock);
    
    return (int32_t) millisToDays(newMoon);
}